

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeader_p.cpp
# Opt level: O2

string * __thiscall
BamTools::Internal::HttpRequestHeader::ToString_abi_cxx11_
          (string *__return_storage_ptr__,HttpRequestHeader *this)

{
  ostream *poVar1;
  string local_1c0;
  stringstream request;
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&request);
  poVar1 = std::operator<<(local_190,(string *)&this->m_method);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = std::operator<<(poVar1,(string *)&this->m_resource);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = std::operator<<(poVar1,(string *)Constants::HTTP_STRING_abi_cxx11_);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->super_HttpHeader).m_majorVersion);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->super_HttpHeader).m_minorVersion);
  poVar1 = std::operator<<(poVar1,(string *)Constants::FIELD_NEWLINE_abi_cxx11_);
  HttpHeader::ToString_abi_cxx11_(&local_1c0,&this->super_HttpHeader);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  std::operator<<(poVar1,(string *)Constants::FIELD_NEWLINE_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&request);
  return __return_storage_ptr__;
}

Assistant:

std::string HttpRequestHeader::ToString() const
{
    std::stringstream request;
    request << m_method << Constants::SPACE_CHAR << m_resource << Constants::SPACE_CHAR
            << Constants::HTTP_STRING << GetMajorVersion() << Constants::DOT_CHAR
            << GetMinorVersion() << Constants::FIELD_NEWLINE << HttpHeader::ToString()
            << Constants::FIELD_NEWLINE;
    return request.str();
}